

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psac.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  ulong uVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  mxx *this;
  unsigned_long *puVar6;
  int *piVar7;
  ostream *poVar8;
  size_t max_local_size;
  rep rVar9;
  ArgException *e_1;
  comm local_b98;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_b78;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_b70;
  double local_b68;
  double end_1;
  comm local_b58;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_b38;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_b30;
  undefined1 local_b28 [8];
  suffix_array<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_unsigned_long,_false>
  sa_1;
  comm local_a48;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_a28;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_a20;
  double local_a18;
  double end;
  comm local_a08;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_9e8;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_9e0;
  undefined1 local_9d8 [8];
  suffix_array<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_unsigned_long,_true>
  sa;
  double start;
  timer t;
  string local_8d0;
  string local_8b0 [8];
  string local_str;
  string local_888;
  allocator local_861;
  string local_860;
  allocator local_839;
  string local_838;
  undefined1 local_818 [8];
  SwitchArg checkArg;
  string local_768;
  allocator local_741;
  string local_740;
  allocator local_719;
  string local_718;
  undefined1 local_6f8 [8];
  SwitchArg lcpArg;
  string local_648;
  allocator local_621;
  string local_620;
  allocator local_5f9;
  string local_5f8;
  allocator local_5d1;
  string local_5d0;
  undefined1 local_5b0 [8];
  ValueArg<int> seedArg;
  string local_4d0;
  allocator local_4a9;
  string local_4a8;
  allocator local_481;
  string local_480;
  allocator local_459;
  string local_458;
  undefined1 local_438 [8];
  ValueArg<unsigned_long> randArg;
  string local_350;
  allocator local_329;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_328;
  allocator local_301;
  string local_300;
  allocator local_2d9;
  string local_2d8;
  allocator local_2b1;
  string local_2b0;
  undefined1 local_290 [8];
  ValueArg<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> fileArg
  ;
  string local_178;
  allocator local_151;
  string local_150;
  undefined1 local_130 [8];
  CmdLine cmd;
  comm comm;
  env local_20;
  env e;
  char **argv_local;
  int argc_local;
  
  argv_local._4_4_ = 0;
  e._vptr_env = (_func_int **)argv;
  argv_local._0_4_ = argc;
  mxx::env::env(&local_20,(int *)&argv_local,(char ***)&e);
  mxx::env::set_exception_on_error();
  mxx::comm::comm((comm *)&cmd._handleExceptions);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_150,"Parallel distirbuted suffix array and LCP construction.",
             &local_151);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_178,"none",(allocator *)((long)&fileArg._constraint + 7));
  TCLAP::CmdLine::CmdLine((CmdLine *)local_130,&local_150,' ',&local_178,true);
  std::__cxx11::string::~string((string *)&local_178);
  std::allocator<char>::~allocator((allocator<char> *)((long)&fileArg._constraint + 7));
  std::__cxx11::string::~string((string *)&local_150);
  std::allocator<char>::~allocator((allocator<char> *)&local_151);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_2b0,"f",&local_2b1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_2d8,"file",&local_2d9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_300,"Input filename.",&local_301);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_328,"",&local_329);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_350,"filename",(allocator *)((long)&randArg._constraint + 7));
  TCLAP::ValueArg<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::ValueArg((ValueArg<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)local_290,&local_2b0,&local_2d8,&local_300,true,&local_328,&local_350,(Visitor *)0x0
            );
  std::__cxx11::string::~string((string *)&local_350);
  std::allocator<char>::~allocator((allocator<char> *)((long)&randArg._constraint + 7));
  std::__cxx11::string::~string((string *)&local_328);
  std::allocator<char>::~allocator((allocator<char> *)&local_329);
  std::__cxx11::string::~string((string *)&local_300);
  std::allocator<char>::~allocator((allocator<char> *)&local_301);
  std::__cxx11::string::~string((string *)&local_2d8);
  std::allocator<char>::~allocator((allocator<char> *)&local_2d9);
  std::__cxx11::string::~string((string *)&local_2b0);
  std::allocator<char>::~allocator((allocator<char> *)&local_2b1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_458,"r",&local_459);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_480,"random",&local_481);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_4a8,"Random input size",&local_4a9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_4d0,"size",(allocator *)((long)&seedArg._constraint + 7));
  TCLAP::ValueArg<unsigned_long>::ValueArg
            ((ValueArg<unsigned_long> *)local_438,&local_458,&local_480,&local_4a8,true,0,&local_4d0
             ,(Visitor *)0x0);
  std::__cxx11::string::~string((string *)&local_4d0);
  std::allocator<char>::~allocator((allocator<char> *)((long)&seedArg._constraint + 7));
  std::__cxx11::string::~string((string *)&local_4a8);
  std::allocator<char>::~allocator((allocator<char> *)&local_4a9);
  std::__cxx11::string::~string((string *)&local_480);
  std::allocator<char>::~allocator((allocator<char> *)&local_481);
  std::__cxx11::string::~string((string *)&local_458);
  std::allocator<char>::~allocator((allocator<char> *)&local_459);
  TCLAP::CmdLine::xorAdd((CmdLine *)local_130,(Arg *)local_290,(Arg *)local_438);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_5d0,"s",&local_5d1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_5f8,"seed",&local_5f9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_620,"Sets the seed for the ranom input generation",&local_621);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_648,"int",(allocator *)&lcpArg.super_Arg.field_0xa7)
  ;
  TCLAP::ValueArg<int>::ValueArg
            ((ValueArg<int> *)local_5b0,&local_5d0,&local_5f8,&local_620,false,0,&local_648,
             (Visitor *)0x0);
  std::__cxx11::string::~string((string *)&local_648);
  std::allocator<char>::~allocator((allocator<char> *)&lcpArg.super_Arg.field_0xa7);
  std::__cxx11::string::~string((string *)&local_620);
  std::allocator<char>::~allocator((allocator<char> *)&local_621);
  std::__cxx11::string::~string((string *)&local_5f8);
  std::allocator<char>::~allocator((allocator<char> *)&local_5f9);
  std::__cxx11::string::~string((string *)&local_5d0);
  std::allocator<char>::~allocator((allocator<char> *)&local_5d1);
  TCLAP::CmdLine::add((CmdLine *)local_130,(Arg *)local_5b0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_718,"l",&local_719);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_740,"lcp",&local_741);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_768,"Construct the LCP alongside the SA.",
             (allocator *)&checkArg.super_Arg.field_0xa7);
  TCLAP::SwitchArg::SwitchArg
            ((SwitchArg *)local_6f8,&local_718,&local_740,&local_768,false,(Visitor *)0x0);
  std::__cxx11::string::~string((string *)&local_768);
  std::allocator<char>::~allocator((allocator<char> *)&checkArg.super_Arg.field_0xa7);
  std::__cxx11::string::~string((string *)&local_740);
  std::allocator<char>::~allocator((allocator<char> *)&local_741);
  std::__cxx11::string::~string((string *)&local_718);
  std::allocator<char>::~allocator((allocator<char> *)&local_719);
  TCLAP::CmdLine::add((CmdLine *)local_130,(Arg *)local_6f8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_838,"c",&local_839);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_860,"check",&local_861);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_888,"Check correctness of SA (and LCP).",
             (allocator *)(local_str.field_2._M_local_buf + 0xf));
  max_local_size = 0;
  TCLAP::SwitchArg::SwitchArg
            ((SwitchArg *)local_818,&local_838,&local_860,&local_888,false,(Visitor *)0x0);
  std::__cxx11::string::~string((string *)&local_888);
  std::allocator<char>::~allocator((allocator<char> *)(local_str.field_2._M_local_buf + 0xf));
  std::__cxx11::string::~string((string *)&local_860);
  std::allocator<char>::~allocator((allocator<char> *)&local_861);
  std::__cxx11::string::~string((string *)&local_838);
  std::allocator<char>::~allocator((allocator<char> *)&local_839);
  TCLAP::CmdLine::add((CmdLine *)local_130,(Arg *)local_818);
  TCLAP::CmdLine::parse((CmdLine *)local_130,(int)argv_local,(char **)e._vptr_env);
  std::__cxx11::string::string(local_8b0);
  __lhs = TCLAP::
          ValueArg<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::getValue((ValueArg<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)local_290);
  bVar2 = std::operator!=(__lhs,"");
  if (bVar2) {
    TCLAP::
    ValueArg<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    getValue((ValueArg<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)local_290);
    this = (mxx *)std::__cxx11::string::c_str();
    mxx::file_block_decompose_abi_cxx11_
              (&local_8d0,this,&ompi_mpi_comm_world,(MPI_Comm)0x0,max_local_size);
    std::__cxx11::string::operator=(local_8b0,(string *)&local_8d0);
    std::__cxx11::string::~string((string *)&local_8d0);
  }
  else {
    puVar6 = TCLAP::ValueArg<unsigned_long>::getValue((ValueArg<unsigned_long> *)local_438);
    uVar1 = *puVar6;
    iVar3 = mxx::comm::size((comm *)&cmd._handleExceptions);
    piVar7 = TCLAP::ValueArg<int>::getValue((ValueArg<int> *)local_5b0);
    iVar5 = *piVar7;
    iVar4 = mxx::comm::rank((comm *)&cmd._handleExceptions);
    rand_dna_abi_cxx11_((string *)&t,uVar1 / (ulong)(long)iVar3,iVar5 * iVar4);
    std::__cxx11::string::operator=(local_8b0,(string *)&t);
    std::__cxx11::string::~string((string *)&t);
  }
  mxx::timer_impl<std::chrono::duration<double,_std::ratio<1L,_1000L>_>_>::timer_impl
            ((timer_impl<std::chrono::duration<double,_std::ratio<1L,_1000L>_>_> *)&start);
  sa.local_LCP.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       (pointer)mxx::timer_impl<std::chrono::duration<double,_std::ratio<1L,_1000L>_>_>::elapsed
                          ((timer_impl<std::chrono::duration<double,_std::ratio<1L,_1000L>_>_> *)
                           &start);
  bVar2 = TCLAP::SwitchArg::getValue((SwitchArg *)local_6f8);
  if (bVar2) {
    local_9e0._M_current = (char *)std::__cxx11::string::begin();
    local_9e8._M_current = (char *)std::__cxx11::string::end();
    end = (double)&ompi_mpi_comm_world;
    mxx::comm::comm(&local_a08,(MPI_Comm *)&end);
    suffix_array<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_unsigned_long,_true>
    ::suffix_array((suffix_array<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_unsigned_long,_true>
                    *)local_9d8,local_9e0,local_9e8,&local_a08);
    mxx::comm::~comm(&local_a08);
    suffix_array<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_unsigned_long,_true>
    ::construct((suffix_array<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_unsigned_long,_true>
                 *)local_9d8,true,0);
    rVar9 = mxx::timer_impl<std::chrono::duration<double,_std::ratio<1L,_1000L>_>_>::elapsed
                      ((timer_impl<std::chrono::duration<double,_std::ratio<1L,_1000L>_>_> *)&start)
    ;
    local_a18 = rVar9 - (double)sa.local_LCP.
                                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage;
    iVar5 = mxx::comm::rank((comm *)&cmd._handleExceptions);
    if (iVar5 == 0) {
      poVar8 = std::operator<<((ostream *)&std::cerr,"PSAC time: ");
      poVar8 = (ostream *)std::ostream::operator<<(poVar8,local_a18);
      poVar8 = std::operator<<(poVar8," ms");
      std::ostream::operator<<(poVar8,std::endl<char,std::char_traits<char>>);
    }
    bVar2 = TCLAP::SwitchArg::getValue((SwitchArg *)local_818);
    if (bVar2) {
      local_a20._M_current = (char *)std::__cxx11::string::begin();
      local_a28._M_current = (char *)std::__cxx11::string::end();
      sa_1.local_LCP.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)&ompi_mpi_comm_world;
      mxx::comm::comm(&local_a48,
                      (MPI_Comm *)
                      &sa_1.local_LCP.
                       super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage);
      gl_check_correct<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,unsigned_long,true>
                ((suffix_array<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_unsigned_long,_true>
                  *)local_9d8,local_a20,local_a28,&local_a48);
      mxx::comm::~comm(&local_a48);
    }
    suffix_array<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_unsigned_long,_true>
    ::~suffix_array((suffix_array<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_unsigned_long,_true>
                     *)local_9d8);
  }
  else {
    local_b30._M_current = (char *)std::__cxx11::string::begin();
    local_b38._M_current = (char *)std::__cxx11::string::end();
    end_1 = (double)&ompi_mpi_comm_world;
    mxx::comm::comm(&local_b58,(MPI_Comm *)&end_1);
    suffix_array<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_unsigned_long,_false>
    ::suffix_array((suffix_array<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_unsigned_long,_false>
                    *)local_b28,local_b30,local_b38,&local_b58);
    mxx::comm::~comm(&local_b58);
    suffix_array<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,unsigned_long,false>::
    construct_arr<2ul>((suffix_array<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,unsigned_long,false>
                        *)local_b28,true);
    rVar9 = mxx::timer_impl<std::chrono::duration<double,_std::ratio<1L,_1000L>_>_>::elapsed
                      ((timer_impl<std::chrono::duration<double,_std::ratio<1L,_1000L>_>_> *)&start)
    ;
    local_b68 = rVar9 - (double)sa.local_LCP.
                                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage;
    iVar5 = mxx::comm::rank((comm *)&cmd._handleExceptions);
    if (iVar5 == 0) {
      poVar8 = std::operator<<((ostream *)&std::cerr,"PSAC time: ");
      poVar8 = (ostream *)std::ostream::operator<<(poVar8,local_b68);
      poVar8 = std::operator<<(poVar8," ms");
      std::ostream::operator<<(poVar8,std::endl<char,std::char_traits<char>>);
    }
    bVar2 = TCLAP::SwitchArg::getValue((SwitchArg *)local_818);
    if (bVar2) {
      local_b70._M_current = (char *)std::__cxx11::string::begin();
      local_b78._M_current = (char *)std::__cxx11::string::end();
      e_1 = (ArgException *)&ompi_mpi_comm_world;
      mxx::comm::comm(&local_b98,(MPI_Comm *)&e_1);
      gl_check_correct<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,unsigned_long,false>
                ((suffix_array<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_unsigned_long,_false>
                  *)local_b28,local_b70,local_b78,&local_b98);
      mxx::comm::~comm(&local_b98);
    }
    suffix_array<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_unsigned_long,_false>
    ::~suffix_array((suffix_array<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_unsigned_long,_false>
                     *)local_b28);
  }
  std::__cxx11::string::~string(local_8b0);
  TCLAP::SwitchArg::~SwitchArg((SwitchArg *)local_818);
  TCLAP::SwitchArg::~SwitchArg((SwitchArg *)local_6f8);
  TCLAP::ValueArg<int>::~ValueArg((ValueArg<int> *)local_5b0);
  TCLAP::ValueArg<unsigned_long>::~ValueArg((ValueArg<unsigned_long> *)local_438);
  TCLAP::ValueArg<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~ValueArg((ValueArg<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)local_290);
  TCLAP::CmdLine::~CmdLine((CmdLine *)local_130);
  argv_local._4_4_ = 0;
  mxx::comm::~comm((comm *)&cmd._handleExceptions);
  mxx::env::~env(&local_20);
  return argv_local._4_4_;
}

Assistant:

int main(int argc, char *argv[]) {
    // set up MPI
    //MPI_Init(&argc, &argv);
    //int rank, p;
    //MPI_Comm_rank(MPI_COMM_WORLD, &rank);
    //MPI_Comm_size(MPI_COMM_WORLD, &p);
    mxx::env e(argc, argv);
    mxx::env::set_exception_on_error();
    mxx::comm comm = mxx::comm();

    try {
    // define commandline usage
    TCLAP::CmdLine cmd("Parallel distirbuted suffix array and LCP construction.");
    TCLAP::ValueArg<std::string> fileArg("f", "file", "Input filename.", true, "", "filename");
    TCLAP::ValueArg<std::size_t> randArg("r", "random", "Random input size", true, 0, "size");
    cmd.xorAdd(fileArg, randArg);
    TCLAP::ValueArg<int> seedArg("s", "seed", "Sets the seed for the ranom input generation", false, 0, "int");
    cmd.add(seedArg);
    TCLAP::SwitchArg  lcpArg("l", "lcp", "Construct the LCP alongside the SA.", false);
    cmd.add(lcpArg);
    TCLAP::SwitchArg  checkArg("c", "check", "Check correctness of SA (and LCP).", false);
    cmd.add(checkArg);
    cmd.parse(argc, argv);

    // read input file or generate input on master processor
    // block decompose input file
    std::string local_str;
    if (fileArg.getValue() != "") {
        local_str = mxx::file_block_decompose(fileArg.getValue().c_str(), MPI_COMM_WORLD);
    } else {
        // TODO proper distributed random!
        local_str = rand_dna(randArg.getValue()/comm.size(), seedArg.getValue() * comm.rank());
    }

    // TODO differentiate between index types

    // run our distributed suffix array construction
    mxx::timer t;
    double start = t.elapsed();
    if (lcpArg.getValue()) {
        // construct with LCP
        suffix_array<std::string::iterator, index_t, true> sa(local_str.begin(), local_str.end(), MPI_COMM_WORLD);
        // TODO choose construction method
        sa.construct(true);
        double end = t.elapsed() - start;
        if (comm.rank() == 0)
            std::cerr << "PSAC time: " << end << " ms" << std::endl;
        if (checkArg.getValue()) {
            gl_check_correct(sa, local_str.begin(), local_str.end(), MPI_COMM_WORLD);
        }
    } else {
        // construct without LCP
        suffix_array<std::string::iterator, index_t, false> sa(local_str.begin(), local_str.end(), MPI_COMM_WORLD);
        // TODO choose construction method
        sa.construct_arr<2>(true);
        double end = t.elapsed() - start;
        if (comm.rank() == 0)
            std::cerr << "PSAC time: " << end << " ms" << std::endl;
        if (checkArg.getValue()) {
            gl_check_correct(sa, local_str.begin(), local_str.end(), MPI_COMM_WORLD);
        }
    }

    // catch any TCLAP exception
    } catch (TCLAP::ArgException& e) {
        std::cerr << "error: " << e.error() << " for arg " << e.argId() << std::endl;
        exit(EXIT_FAILURE);
    }

    // finalize MPI
    //MPI_Finalize();

    return 0;
}